

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DExporter::Export_MetadataFloat
          (X3DExporter *this,aiString *pKey,float pValue,size_t pTabLevel)

{
  allocator<char> local_76;
  allocator<char> local_75;
  float local_74;
  undefined1 local_70 [32];
  string local_50;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&attr_list;
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node._M_size = 0;
  local_74 = pValue;
  attr_list.
  super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       attr_list.
       super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"name",&local_76);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_70 + 0x20),pKey->data,&local_75);
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::push_back
            (&attr_list,(value_type *)local_70);
  SAttribute::~SAttribute((SAttribute *)local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"value",&local_76);
  std::__cxx11::to_string((string *)(local_70 + 0x20),local_74);
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::push_back
            (&attr_list,(value_type *)local_70);
  SAttribute::~SAttribute((SAttribute *)local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"MetadataFloat",&local_76);
  NodeHelper_OpenNode(this,(string *)local_70,pTabLevel,true,&attr_list);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear(&attr_list.
            super__List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
          );
  return;
}

Assistant:

void X3DExporter::Export_MetadataFloat(const aiString& pKey, const float pValue, const size_t pTabLevel)
{
list<SAttribute> attr_list;

	attr_list.push_back({"name", pKey.C_Str()});
	attr_list.push_back({"value", to_string(pValue)});
	NodeHelper_OpenNode("MetadataFloat", pTabLevel, true, attr_list);
}